

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O2

MetaIterator __thiscall rtosc::Port::MetaContainer::find(MetaContainer *this,char *str)

{
  int iVar1;
  char *pcVar2;
  MetaIterator MVar3;
  MetaIterator MVar4;
  MetaIterator x;
  MetaIterator __begin1;
  MetaIterator local_48;
  MetaIterator local_30;
  
  MVar3 = begin(this);
  local_30 = MVar3;
  MVar4 = end(this);
  pcVar2 = MVar3.title;
  while (pcVar2 != MVar4.title) {
    pcVar2 = local_30.title;
    local_48.title = local_30.title;
    local_48.value = local_30.value;
    iVar1 = strcmp(local_30.title,str);
    if (iVar1 == 0) goto LAB_001054dc;
    MetaIterator::operator++(&local_30);
    pcVar2 = local_30.title;
  }
  MetaIterator::MetaIterator(&local_48,(char *)0x0);
  pcVar2 = local_48.title;
LAB_001054dc:
  MVar3.value = local_48.value;
  MVar3.title = pcVar2;
  return MVar3;
}

Assistant:

Port::MetaIterator Port::MetaContainer::find(const char *str) const
{
    for(const auto x : *this)
        if(!strcmp(x.title, str))
            return x;
    return NULL;
}